

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::Unshift<Js::JavascriptArray::BigIndex,unsigned_int>
               (RecyclableObject *obj,BigIndex *toIndex,uint start,uint end,
               ScriptContext *scriptContext)

{
  uint64 *this;
  bool bVar1;
  BOOL BVar2;
  Var newValue;
  BigIndex BVar3;
  undefined1 local_80 [8];
  BigIndex dst;
  BigIndex newEnd;
  JsReentLock jsReentLock;
  
  newEnd.bigIndex = (uint64)scriptContext->threadContext;
  bVar1 = ((ThreadContext *)newEnd.bigIndex)->noJsReentrancy;
  ((ThreadContext *)newEnd.bigIndex)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)&newEnd.bigIndex,obj);
  if (start < end) {
    BigIndex::BigIndex((BigIndex *)&dst.bigIndex,~start + end);
    BVar3 = BigIndex::operator+(toIndex,(BigIndex *)&dst.bigIndex);
    dst._0_8_ = BVar3.bigIndex;
    local_80._0_4_ = BVar3.index;
    this = &newEnd.bigIndex;
    while (start < end) {
      *(bool *)(newEnd.bigIndex + 0x108) = bVar1;
      end = end - 1;
      BVar2 = JavascriptOperators::HasItem(obj,end);
      JsReentLock::MutateArrayObject((JsReentLock *)this);
      *(undefined1 *)(newEnd.bigIndex + 0x108) = 1;
      *(bool *)(newEnd.bigIndex + 0x108) = bVar1;
      if (BVar2 == 0) {
        BVar2 = BigIndex::DeleteItem
                          ((BigIndex *)local_80,obj,PropertyOperation_ThrowOnDeleteIfNotConfig);
        if (BVar2 == 0) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.unshift");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)this);
      }
      else {
        newValue = JavascriptOperators::GetItem(obj,end,scriptContext);
        BVar2 = BigIndex::SetItem((BigIndex *)local_80,obj,newValue,
                                  PropertyOperation_ThrowIfNotExtensible);
        if (BVar2 == 0) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.unshift");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)this);
      }
      *(undefined1 *)(newEnd.bigIndex + 0x108) = 1;
      BigIndex::operator--((BigIndex *)local_80);
    }
  }
  *(bool *)(newEnd.bigIndex + 0x108) = bVar1;
  return;
}

Assistant:

void JavascriptArray::Unshift(RecyclableObject* obj, const T& toIndex, P start, P end, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        typedef IndexTrace<T> index_trace;

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.unshift"));
        if (start < end)
        {
            T newEnd = (end - start - 1);// newEnd - 1
            T dst = toIndex + newEnd;
            for (P i = end; i > start; --i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i - 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, i - 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(index_trace::SetItem(obj, dst, element, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(index_trace::DeleteItem(obj, dst, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }

                --dst;
            }
        }
    }